

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall FlowGraph::UpdateRegionForBlock(FlowGraph *this,BasicBlock *block)

{
  IRKind IVar1;
  BasicBlock *pBVar2;
  code *pcVar3;
  bool bVar4;
  ExecutionMode EVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Type *ppFVar8;
  BasicBlock *pBVar9;
  long lVar10;
  Func **ppFVar11;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar12;
  Instr *pIVar13;
  BasicBlock *pBVar14;
  Instr *local_60;
  Instr *tryInstr;
  Iterator __iter;
  BasicBlock *local_40;
  BasicBlock *block_local;
  Region *region;
  
  local_60 = (Instr *)0x0;
  pIVar13 = block->firstInstr;
  local_40 = block;
  if (((pIVar13->m_kind == InstrKindProfiledLabel) || (pIVar13->m_kind == InstrKindLabel)) &&
     (pIVar13[1].m_src2 != (Opnd *)0x0)) {
    BVar6 = Func::HasTry(this->func);
    if (BVar6 != 0) {
      bVar4 = Func::DoOptimizeTry(this->func);
      if (bVar4) {
        return;
      }
      EVar5 = JITTimeWorkItem::GetJitMode(this->func->m_workItem);
      if ((EVar5 == SimpleJit) && ((this->func->field_0x240 & 0x10) != 0)) {
        return;
      }
      bVar4 = Func::IsLoopBodyInTryFinally(this->func);
      if (bVar4) {
        return;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x77c,"(assignRegionsBeforeGlobopt)","assignRegionsBeforeGlobopt");
    if (bVar4) {
      *puVar7 = 0;
      return;
    }
    goto LAB_0041179a;
  }
  if (this->blockList == block) {
    pBVar14 = (BasicBlock *)0x0;
    block_local = (BasicBlock *)Region::New(RegionTypeRoot,(Region *)0x0,this->func);
LAB_0041153c:
    if (block_local != (BasicBlock *)0x0) goto LAB_00411541;
  }
  else {
    block_local = (BasicBlock *)0x0;
    pSVar12 = &(block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    tryInstr = (Instr *)pSVar12;
    __iter.list = pSVar12;
    __iter.current = (NodeBase *)pIVar13;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (pSVar12 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_0041179a;
        *puVar7 = 0;
        pSVar12 = __iter.list;
      }
      pIVar13 = (Instr *)(((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                          &pSVar12->super_SListNodeBase<Memory::ArenaAllocator>)->
                         super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pIVar13 == tryInstr) {
        pBVar14 = (BasicBlock *)0x0;
        goto LAB_004113f7;
      }
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)pIVar13;
      ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&tryInstr);
      pBVar9 = (*ppFVar8)->predBlock;
      if (pBVar9 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x78a,"(predBlock)","predBlock");
        if (!bVar4) goto LAB_0041179a;
        *puVar7 = 0;
      }
      if (this->blockCount <= pBVar9->number) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x78c,"(predBlock->GetBlockNum() < this->blockCount)",
                           "Misnumbered block at teardown time?");
        if (!bVar4) goto LAB_0041179a;
        *puVar7 = 0;
      }
      pIVar13 = pBVar9->firstInstr;
      IVar1 = pIVar13->m_kind;
      if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar4) goto LAB_0041179a;
        *puVar7 = 0;
      }
      pBVar14 = (BasicBlock *)pIVar13[1].m_src2;
      pSVar12 = __iter.list;
    } while (pBVar14 == (BasicBlock *)0x0);
    block_local = (BasicBlock *)
                  PropagateRegionFromPred(this,local_40,pBVar9,(Region *)pBVar14,&local_60);
LAB_004113f7:
    pBVar9 = local_40->next;
    ppFVar11 = (Func **)&pBVar9->firstInstr;
    if (pBVar9 == (BasicBlock *)0x0) {
      ppFVar11 = &local_40->func;
    }
    lVar10 = 0x18;
    if (pBVar9 == (BasicBlock *)0x0) {
      lVar10 = 0xd0;
    }
    pIVar13 = (Instr *)__iter.current;
    if (((*(ushort *)(*(long *)((long)&(*ppFVar11)->m_alloc + lVar10) + 0x30) & 0xfffe) != 0xea) ||
       (this->regToFinallyEndMap ==
        (BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0)) goto LAB_0041153c;
    if (*(char *)&block_local->next == '\x04') {
      if (*(BasicBlock **)
           &(block_local->loop->blockList).
            super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount ==
          block_local) {
        bVar4 = JsUtil::
                BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(this->regToFinallyEndMap,(Region **)&block_local);
        if ((bVar4) &&
           (pBVar9 = JsUtil::
                     BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ::Item(this->regToFinallyEndMap,(Region **)&block_local),
           pBVar9 != (BasicBlock *)0x0)) {
          pBVar2 = pBVar9->next;
          ppFVar11 = (Func **)&pBVar2->firstInstr;
          if (pBVar2 == (BasicBlock *)0x0) {
            ppFVar11 = &pBVar9->func;
          }
          lVar10 = 0x18;
          if (pBVar2 == (BasicBlock *)0x0) {
            lVar10 = 0xd0;
          }
          if ((*(short *)(*(long *)((long)&(*ppFVar11)->m_alloc + lVar10) + 0x30) == 0xea) &&
             (local_40 != pBVar9)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x7a1,
                               "(endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally)"
                               ,
                               "endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally"
                              );
            if (!bVar4) goto LAB_0041179a;
            *puVar7 = 0;
          }
          JsUtil::
          BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                    ((BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->regToFinallyEndMap,(Region **)&block_local,&local_40);
          pIVar13 = (Instr *)__iter.current;
        }
        else {
          JsUtil::
          BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->regToFinallyEndMap,(Region **)&block_local,&local_40);
          pIVar13 = (Instr *)__iter.current;
        }
      }
      goto LAB_0041153c;
    }
LAB_00411541:
    if (block_local->excludeByteCodeUpwardExposedTracking ==
        (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Region::AllocateEHBailoutData((Region *)block_local,this->func,local_60);
    }
  }
  if ((pIVar13->m_kind != InstrKindLabel) && (pIVar13->m_kind != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x7ad,"(firstInstr->IsLabelInstr())","firstInstr->IsLabelInstr()");
    if (!bVar4) {
LAB_0041179a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
    if ((pIVar13->m_kind != InstrKindProfiledLabel) && (pIVar13->m_kind != InstrKindLabel)) {
      return;
    }
  }
  pIVar13[1].m_src2 = (Opnd *)block_local;
  if (block_local == pBVar14) {
    if ((*(byte *)&pIVar13[1].m_func & 4) == 0) {
      pSVar12 = &(local_40->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>
      ;
      tryInstr = (Instr *)pSVar12;
      __iter.list = pSVar12;
      __iter.current = (NodeBase *)pIVar13;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        if (pSVar12 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) goto LAB_0041179a;
          *puVar7 = 0;
          pSVar12 = __iter.list;
        }
        __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                      (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                       &pSVar12->super_SListNodeBase<Memory::ArenaAllocator>)->
                      super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((Instr *)__iter.list == tryInstr) {
          return;
        }
        ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&tryInstr);
        pBVar14 = (*ppFVar8)->predBlock;
        if (pBVar14 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7bf,"(predBlock)","predBlock");
          if (!bVar4) goto LAB_0041179a;
          *puVar7 = 0;
        }
        if (this->blockCount <= pBVar14->number) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7c1,"(predBlock->GetBlockNum() < this->blockCount)",
                             "Misnumbered block at teardown time?");
          if (!bVar4) goto LAB_0041179a;
          *puVar7 = 0;
        }
        pIVar13 = pBVar14->firstInstr;
        IVar1 = pIVar13->m_kind;
        if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar4) goto LAB_0041179a;
          *puVar7 = 0;
        }
        pSVar12 = __iter.list;
      } while ((BasicBlock *)pIVar13[1].m_src2 == block_local);
      *(byte *)&__iter.current[0xf].next = *(byte *)&__iter.current[0xf].next | 4;
    }
  }
  else {
    *(byte *)&pIVar13[1].m_func = *(byte *)&pIVar13[1].m_func | 4;
  }
  return;
}

Assistant:

void
FlowGraph::UpdateRegionForBlock(BasicBlock * block)
{
    Region *region;
    Region * predRegion = nullptr;
    IR::Instr * tryInstr = nullptr;
    IR::Instr * firstInstr = block->GetFirstInstr();
    if (firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->GetRegion())
    {
#if DBG
        bool assignRegionsBeforeGlobopt = this->func->HasTry() && (this->func->DoOptimizeTry() ||
        (this->func->IsSimpleJit() && this->func->hasBailout) ||
        this->func->IsLoopBodyInTryFinally());
        Assert(assignRegionsBeforeGlobopt);
#endif
        return;
    }

    if (block == this->blockList)
    {
        // Head of the graph: create the root region.
        region = Region::New(RegionTypeRoot, nullptr, this->func);
    }
    else
    {
        // Propagate the region forward by finding a predecessor we've already processed.
        region = nullptr;
        FOREACH_PREDECESSOR_BLOCK(predBlock, block)
        {
            AssertMsg(predBlock->GetBlockNum() < this->blockCount, "Misnumbered block at teardown time?");
            predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
            if (predRegion != nullptr)
            {
                region = this->PropagateRegionFromPred(block, predBlock, predRegion, tryInstr);
                break;
            }
        }
        NEXT_PREDECESSOR_BLOCK;

        if (block->GetLastInstr()->m_opcode == Js::OpCode::LeaveNull || block->GetLastInstr()->m_opcode == Js::OpCode::Leave)
        {
            if (this->regToFinallyEndMap && region->IsNonExceptingFinally())
            {
                BasicBlock *endOfFinally = regToFinallyEndMap->ContainsKey(region) ? regToFinallyEndMap->Item(region) : nullptr;
                if (!endOfFinally)
                {
                    regToFinallyEndMap->Add(region, block);
                }
                else
                {
                    Assert(endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally);
                    regToFinallyEndMap->Item(region, block);
                }
            }
        }
    }

    if (region && !region->ehBailoutData)
    {
        region->AllocateEHBailoutData(this->func, tryInstr);
    }

    Assert(firstInstr->IsLabelInstr());
    if (firstInstr->IsLabelInstr())
    {
        // Record the region on the label and make sure it stays around as a region
        // marker if we're entering a region at this point.
        IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
        labelInstr->SetRegion(region);
        if (region != predRegion)
        {
            labelInstr->m_hasNonBranchRef = true;
        }

        // One of the pred blocks maybe an eh region, in that case it is important to mark this label's m_hasNonBranchRef
        // If not later in codegen, this label can get deleted. And during SccLiveness, region is propagated to newly created labels in lowerer from the previous label's region
        // We can end up assigning an eh region to a label in a non eh region. And if there is a bailout in such a region, bad things will happen in the interpreter :)
        // See test2()/test3() in tryfinallytests.js
        if (!labelInstr->m_hasNonBranchRef)
        {
            FOREACH_PREDECESSOR_BLOCK(predBlock, block)
            {
                AssertMsg(predBlock->GetBlockNum() < this->blockCount, "Misnumbered block at teardown time?");
                predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
                if (predRegion != region)
                {
                    labelInstr->m_hasNonBranchRef = true;
                    break;
                }
            }
            NEXT_PREDECESSOR_BLOCK;
        }
    }
}